

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::Validator::CheckAtomicExpr<wabt::LoadStoreExpr<(wabt::ExprType)5>>
          (Validator *this,LoadStoreExpr<(wabt::ExprType)5> *expr,offset_in_TypeChecker_to_subr func
          )

{
  Address alignment;
  Address natural_alignment;
  long in_RCX;
  code *local_78;
  offset_in_TypeChecker_to_subr func_local;
  LoadStoreExpr<(wabt::ExprType)5> *expr_local;
  Validator *this_local;
  
  anon_unknown_7::Validator::CheckHasSharedMemory
            ((Validator *)this,(Location *)&expr->field_0x18,(Opcode)(expr->opcode).enum_);
  alignment = expr->align;
  natural_alignment = anon_unknown_7::get_opcode_natural_alignment((Opcode)(expr->opcode).enum_);
  anon_unknown_7::Validator::CheckAtomicAlign
            ((Validator *)this,(Location *)&expr->field_0x18,alignment,natural_alignment);
  local_78 = (code *)func;
  if ((func & 1) != 0) {
    local_78 = *(code **)(*(long *)(this + in_RCX + 0x48) + (func - 1));
  }
  (*local_78)(this + in_RCX + 0x48,(expr->opcode).enum_);
  return;
}

Assistant:

void Validator::CheckAtomicExpr(const T* expr,
                                Result (TypeChecker::*func)(Opcode)) {
  CheckHasSharedMemory(&expr->loc, expr->opcode);
  CheckAtomicAlign(&expr->loc, expr->align,
                   get_opcode_natural_alignment(expr->opcode));
  (typechecker_.*func)(expr->opcode);
}